

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Rep *pRVar1;
  undefined8 uVar2;
  RepeatedPtrFieldBase local_30;
  
  local_30.arena_ = other->arena_;
  local_30.current_size_ = 0;
  local_30.total_size_ = 0;
  local_30.rep_ = (Rep *)0x0;
  MergeFrom<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (&local_30,this);
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(this);
  MergeFrom<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(this,other);
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(other);
  pRVar1 = other->rep_;
  other->rep_ = local_30.rep_;
  uVar2._0_4_ = other->current_size_;
  uVar2._4_4_ = other->total_size_;
  other->current_size_ = local_30.current_size_;
  other->total_size_ = local_30.total_size_;
  local_30._8_8_ = uVar2;
  local_30.rep_ = pRVar1;
  Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(&local_30);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(other->GetArenaNoVirtual() != GetArenaNoVirtual());

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied cross-arena only
  // once, not twice.
  RepeatedPtrFieldBase temp(other->GetArenaNoVirtual());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->Clear<TypeHandler>();
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}